

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

void __thiscall FIX::SocketConnection::readMessages(SocketConnection *this,SocketMonitor *s)

{
  Session *this_00;
  bool bVar1;
  InvalidMessage *anon_var_0;
  undefined1 local_38 [8];
  string msg;
  SocketMonitor *s_local;
  SocketConnection *this_local;
  
  if (this->m_pSession != (Session *)0x0) {
    msg.field_2._8_8_ = s;
    std::__cxx11::string::string((string *)local_38);
    while (bVar1 = readMessage(this,(string *)local_38), bVar1) {
      this_00 = this->m_pSession;
      UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&anon_var_0);
      Session::next(this_00,(string *)local_38,(UtcTimeStamp *)&anon_var_0,false);
      UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&anon_var_0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void SocketConnection::readMessages( SocketMonitor& s )
{
  if( !m_pSession ) return;

  std::string msg;
  while( readMessage( msg ) )
  {
    try
    {
      m_pSession->next( msg, UtcTimeStamp() );
    }
    catch ( InvalidMessage& )
    {
      if( !m_pSession->isLoggedOn() )
        s.drop( m_socket );
    }
  }
}